

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::createInstance
          (TextureGatherCubeCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize offsetSize;
  VkPhysicalDeviceProperties *pVVar1;
  TextureGatherCubeInstance *this_00;
  anon_unknown_0 local_38 [8];
  undefined1 local_30 [8];
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  Context *context_local;
  TextureGatherCubeCase *this_local;
  
  gatherType = (this->m_baseParams).gatherType;
  offsetSize = (this->m_baseParams).offsetSize;
  iterations.
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)context;
  pVVar1 = Context::getDeviceProperties(context);
  getOffsetRange(local_38,offsetSize,&pVVar1->limits);
  generateCubeCaseIterations
            ((vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
              *)local_30,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)local_38);
  this_00 = (TextureGatherCubeInstance *)operator_new(1000);
  TextureGatherCubeInstance::TextureGatherCubeInstance
            (this_00,(Context *)
                     iterations.
                     super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_baseParams,
             this->m_textureSize,
             (vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
              *)local_30);
  std::
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  ::~vector((vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             *)local_30);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGatherCubeCase::createInstance (Context& context) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits));

	return new TextureGatherCubeInstance(context, m_baseParams, m_textureSize, iterations);
}